

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall Camera::_castShadowRays(Camera *this,Intersection *i,World *world)

{
  undefined8 uVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  pointer ppPVar4;
  PointLight *pPVar5;
  SceneObject *pSVar6;
  double dVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  ColorRGB CVar14;
  ColorRGB local_f0;
  float local_e4;
  Intersection *local_e0;
  ColorRGB *local_d8;
  ulong local_d0;
  ulong local_c8;
  double local_c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_a8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_98;
  float fStack_8c;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_68;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  
  ppSVar2 = (world->sceneObjects->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (world->sceneObjects->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (ulong)((long)(world->pointLights->
                         super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(world->pointLights->
                        super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  Ray::Ray((Ray *)&local_98.field_0);
  ColorRGB::ColorRGB(&local_f0);
  if ((int)uVar10 < 1) {
    fVar12 = local_f0.r;
    fVar13 = local_f0.g;
  }
  else {
    local_c8 = (ulong)((long)ppSVar3 - (long)ppSVar2) >> 3;
    local_d8 = &i->color;
    local_d0 = uVar10 & 0x7fffffff;
    uVar10 = local_c8 & 0x7fffffff;
    uVar11 = 0;
    local_e0 = i;
    do {
      ppPVar4 = (world->pointLights->super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = uVar11;
      if ((ulong)((long)(world->pointLights->
                        super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3) <= uVar11) {
LAB_00104984:
        do {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
          uVar9 = uVar11;
        } while( true );
      }
      pPVar5 = ppPVar4[uVar11];
      local_a8.field_0.z = (i->intersectionPoint).field_0.field_0.z;
      local_b8.field_0.z = (pPVar5->position).field_0.field_0.z - local_a8.field_0.z;
      uVar1 = *(undefined8 *)&(pPVar5->position).field_0;
      local_a8._0_8_ = *(undefined8 *)&(i->intersectionPoint).field_0;
      fVar12 = (float)uVar1 - (float)local_a8._0_8_;
      fVar13 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)local_a8._0_8_ >> 0x20);
      local_b8._0_8_ = CONCAT44(fVar13,fVar12);
      local_e4 = SQRT(local_b8.field_0.z * local_b8.field_0.z + fVar12 * fVar12 + fVar13 * fVar13);
      Ray::Ray((Ray *)&local_68.field_0,(vec3 *)&local_a8.field_0,(vec3 *)&local_b8.field_0,0.1,
               local_e4);
      local_98.field_0.x = local_68.field_0.x;
      local_98.field_0.y = local_68.field_0.y;
      local_98.field_0.z = local_68.field_0.z;
      fStack_8c = fStack_5c;
      local_88 = local_58;
      fStack_84 = fStack_54;
      uStack_80 = uStack_50;
      uStack_7c = uStack_4c;
      local_78 = local_48;
      if (0 < (int)local_c8) {
        uVar9 = 0;
        do {
          ppSVar2 = (world->sceneObjects->
                    super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(world->sceneObjects->
                            super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <= uVar9
             ) goto LAB_00104984;
          pSVar6 = ppSVar2[uVar9];
          iVar8 = (*pSVar6->_vptr_SceneObject[2])(pSVar6,&local_98);
          if (CONCAT44(extraout_var,iVar8) != 0) {
            CVar14 = ColorRGB::operator*(local_d8,0.001);
            CVar14 = ColorRGB::operator+(&local_f0,CVar14);
            local_f0.b = CVar14.b;
            fVar12 = CVar14.r;
            fVar13 = CVar14.g;
            local_f0._0_8_ = CVar14._0_8_;
            i = local_e0;
            goto LAB_0010493d;
          }
          uVar9 = uVar9 + 1;
          i = local_e0;
        } while (uVar10 != uVar9);
      }
      local_c0 = (double)(fStack_84 * (i->surfaceNormal).field_0.field_0.z +
                         fStack_8c * (i->surfaceNormal).field_0.field_0.x +
                         local_88 * (i->surfaceNormal).field_0.field_0.y);
      dVar7 = log((double)local_e4 * 0.5);
      fVar12 = 0.0;
      if (0.0 <= (float)(local_c0 / dVar7)) {
        fVar12 = (float)(local_c0 / dVar7);
      }
      CVar14 = ColorRGB::operator*(&pPVar5->color,fVar12);
      local_68.field_0.z = CVar14.b;
      local_68._0_8_ = CVar14._0_8_;
      CVar14 = ColorRGB::operator+((ColorRGB *)&local_68.field_0,world->ambientColor);
      CVar14 = ColorRGB::operator*(local_d8,CVar14);
      CVar14 = ColorRGB::operator+(&local_f0,CVar14);
      local_f0.b = CVar14.b;
      fVar12 = CVar14.r;
      fVar13 = CVar14.g;
      local_f0._0_8_ = CVar14._0_8_;
LAB_0010493d:
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_d0);
  }
  CVar14.g = fVar13;
  CVar14.r = fVar12;
  CVar14.b = local_f0.b;
  ColorRGB::setColor(&i->color,CVar14);
  return;
}

Assistant:

void Camera::_castShadowRays(Intersection *i, World *world) {
    
    int numObjects = world->sceneObjects->size();
    int numLights = world->pointLights->size();
    glm::vec3 lightDir;
    Ray shadowRay;
    PointLight *pl;
    SceneObject *obj;
    float r, intensity;
    ColorRGB ackColor = ColorRGB();
    bool noHit;
    
    for(int l = 0; l < numLights; ++l) {
        pl = world->pointLights->at(l);
        lightDir = pl->position - i->intersectionPoint;
        r = glm::length(lightDir);
        shadowRay = Ray(i->intersectionPoint, lightDir, 0.1, r);
        noHit = true;
        
        for(int o = 0; o < numObjects; ++o) {
            obj = world->sceneObjects->at(o);
            if( obj->intersects(shadowRay) ) {
                ackColor = ackColor + i->color * 0.001;
                noHit = false; break;
            }
        }

        if(noHit) {
			intensity = glm::dot(i->surfaceNormal, shadowRay.dir) * 1 / std::log(0.5*r);
			if(intensity < 0.0) intensity = 0.0;
			ackColor = ackColor + i->color * (pl->color * intensity + world->ambientColor);
        }
    }
    i->color.setColor(ackColor);
}